

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O1

Reals Omega_h::repeat_matrix<3>(LO n,Tensor<3> m)

{
  long lVar1;
  undefined8 *puVar2;
  double *pdVar3;
  Int i;
  double *pdVar4;
  undefined4 in_register_0000003c;
  double *pdVar5;
  undefined8 *puVar6;
  Int j;
  long lVar7;
  Reals RVar8;
  Reals RVar9;
  Vector<9> v;
  Few<double,_9> in_stack_ffffffffffffff18;
  undefined8 local_98 [9];
  double local_50 [9];
  
  RVar9.write_.shared_alloc_.alloc._4_4_ = in_register_0000003c;
  RVar9.write_.shared_alloc_.alloc._0_4_ = n;
  pdVar3 = local_50;
  pdVar4 = (double *)&m;
  pdVar5 = pdVar3;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar5 = *pdVar4;
    pdVar4 = pdVar4 + 1;
    pdVar5 = pdVar5 + 1;
  }
  puVar2 = local_98;
  lVar1 = 0;
  do {
    lVar7 = 0;
    pdVar4 = pdVar3;
    do {
      puVar2[lVar7] = *pdVar4;
      lVar7 = lVar7 + 1;
      pdVar4 = pdVar4 + 3;
    } while (lVar7 != 3);
    lVar1 = lVar1 + 1;
    puVar2 = puVar2 + 3;
    pdVar3 = pdVar3 + 1;
  } while (lVar1 != 3);
  puVar2 = local_98;
  puVar6 = (undefined8 *)&stack0xffffffffffffff18;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar6 = *puVar2;
    puVar2 = puVar2 + 1;
    puVar6 = puVar6 + 1;
  }
  RVar8 = repeat_vector<9>(n,(Vector<9>)in_stack_ffffffffffffff18.array_);
  RVar9.write_.shared_alloc_.direct_ptr = RVar8.write_.shared_alloc_.direct_ptr;
  return (Reals)RVar9.write_.shared_alloc_;
}

Assistant:

Reals repeat_matrix(LO const n, Tensor<dim> const m) {
  return repeat_vector(n, matrix2vector(m));
}